

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::call_matcher_list<bool_(int)>::~call_matcher_list(call_matcher_list<bool_(int)> *this)

{
  list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *plVar1;
  list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *plVar2;
  list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *n;
  
  (this->super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>).
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f6858;
  plVar1 = (this->
           super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>).
           super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  if (plVar1 == (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)this) {
    (this->super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>).
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)&PTR__list_elem_004f6878;
    plVar2 = (this->
             super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>).
             super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev;
    plVar1->prev = plVar2;
    plVar2->next = plVar1;
    (this->super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>).
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)this;
    (this->super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>).
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)this;
    operator_delete(this,0x18);
    return;
  }
  abort();
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto& elem = *i;
      ++i; // intrusive list, so advance before destroying
      Disposer::dispose(&elem);
    }
  }